

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>(ChArchiveIn *this,ChNameValue<chrono::ChEnumMapper<myEnum>_> *bVal)

{
  ChNameValue<chrono::ChEnumMapper<myEnum>_> local_30;
  ChNameValue<chrono::ChEnumMapper<myEnum>_> *local_18;
  ChNameValue<chrono::ChEnumMapper<myEnum>_> *bVal_local;
  ChArchiveIn *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<chrono::ChEnumMapper<myEnum>_> *)this;
  ChNameValue<chrono::ChEnumMapper<myEnum>_>::ChNameValue(&local_30,bVal);
  in<myEnum>(this,&local_30);
  ChNameValue<chrono::ChEnumMapper<myEnum>_>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }